

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O1

bool anon_unknown.dwarf_f0d44::checkPixels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,Array2D<Imath_3_2::half_*> *ph,int width,
               int height)

{
  float *pfVar1;
  uint uVar2;
  char cVar3;
  ulong uVar4;
  ostream *poVar5;
  long *plVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  float fVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  
  bVar17 = height < 1;
  if (0 < height) {
    uVar8 = 0;
    bVar17 = false;
    do {
      if (0 < width) {
        bVar15 = false;
        uVar14 = 0;
        do {
          uVar4 = (ulong)sampleCount->_data[sampleCount->_sizeY * uVar8 + uVar14];
          if (uVar4 != 0) {
            iVar9 = ((int)uVar8 * width + (int)uVar14) % 0x801;
            fVar18 = (float)iVar9;
            uVar12 = (uint)fVar18 & 0x7fffff | 0x800000;
            cVar3 = (char)((uint)fVar18 >> 0x17);
            fVar10 = ABS(fVar18);
            uVar7 = (uint)fVar18 >> 0x10 & 0x8000;
            uVar11 = (uint)fVar18 >> 0xd & 0x3ff;
            uVar2 = uVar7 + 0x7c00;
            if ((uint)fVar10 < 0x477ff000) {
              uVar2 = (int)fVar10 + 0x8000fff + (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd |
                      uVar7;
            }
            uVar11 = uVar11 == 0 | uVar11;
            if (fVar10 == INFINITY) {
              uVar11 = 0;
            }
            uVar11 = uVar7 + 0x7c00 + uVar11;
            if ((uint)fVar10 < 0x7f800000) {
              uVar11 = uVar2;
            }
            uVar2 = (uint)(0x80000000 < uVar12 << (cVar3 + 0xa2U & 0x1f)) +
                    (uVar12 >> (0x7eU - cVar3 & 0x1f) | uVar7);
            if ((uint)fVar10 < 0x33000001) {
              uVar2 = uVar7;
            }
            fVar18 = *(float *)(_imath_half_to_float_table +
                               (ulong)ph->_data[ph->_sizeY * uVar8 + uVar14]->_h * 4);
            if (0x387fffff < (uint)fVar10) {
              uVar2 = uVar11;
            }
            pfVar1 = (float *)(_imath_half_to_float_table + ((ulong)uVar2 & 0xffff) * 4);
            if ((fVar18 != *pfVar1) || (NAN(fVar18) || NAN(*pfVar1))) {
              bVar16 = true;
              uVar13 = 0;
            }
            else {
              uVar13 = 0;
              do {
                if (uVar4 - 1 == uVar13) goto LAB_0014d7c1;
                fVar10 = *(float *)(_imath_half_to_float_table +
                                   (ulong)ph->_data[ph->_sizeY * uVar8 + uVar14][uVar13 + 1]._h * 4)
                ;
                uVar13 = uVar13 + 1;
                pfVar1 = (float *)(_imath_half_to_float_table + ((ulong)uVar2 & 0xffff) * 4);
              } while ((fVar10 == *pfVar1) && (!NAN(fVar10) && !NAN(*pfVar1)));
              bVar16 = uVar13 < uVar4;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", sample ",9);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
            poVar5 = (ostream *)
                     ::operator<<(poVar5,(half)ph->_data[ph->_sizeY * uVar8 + uVar14][uVar13]._h);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", should be ",0xc);
            plVar6 = (long *)std::ostream::operator<<(poVar5,iVar9);
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            std::ostream::flush();
            std::ostream::flush();
            if (bVar16) {
              if (!bVar15) {
                return bVar17;
              }
              break;
            }
          }
LAB_0014d7c1:
          uVar4 = uVar14 + 1;
          bVar15 = (long)(width + -1) <= (long)uVar14;
          uVar14 = uVar4;
        } while (uVar4 != (uint)width);
      }
      bVar17 = height - 1 <= uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)height);
  }
  return bVar17;
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    return checkPixels<T> (sampleCount, ph, 0, width - 1, 0, height - 1, width);
}